

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repository.cpp
# Opt level: O0

void so_5::stats::repository_t::source_list_remove(source_t *what,source_t **head,source_t **tail)

{
  source_t **tail_local;
  source_t **head_local;
  source_t *what_local;
  
  if (what->m_prev == (source_t *)0x0) {
    *head = what->m_next;
  }
  else {
    what->m_prev->m_next = what->m_next;
  }
  if (what->m_next == (source_t *)0x0) {
    *tail = what->m_prev;
  }
  else {
    what->m_next->m_prev = what->m_prev;
  }
  return;
}

Assistant:

void
repository_t::source_list_remove(
	source_t & what,
	source_t *& head,
	source_t *& tail )
	{
		if( what.m_prev )
			what.m_prev->m_next = what.m_next;
		else
			head = what.m_next;

		if( what.m_next )
			what.m_next->m_prev = what.m_prev;
		else
			tail = what.m_prev;
	}